

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

bool __thiscall
qpdf::Tokenizer::nextToken(Tokenizer *this,InputSource *input,string *context,size_t max_len)

{
  char ch;
  bool bVar1;
  int iVar2;
  state_e sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  qpdf_offset_t offset;
  qpdf_offset_t qVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (this->state != st_inline_image) {
    reset(this);
  }
  if (input->buf_len != 0) {
    iVar2 = (*input->_vptr_InputSource[4])(input);
    qVar4 = CONCAT44(extraout_var,iVar2);
    lVar6 = input->buf_start;
    if ((lVar6 <= qVar4) && (qVar4 < lVar6 + input->buf_len)) {
      input->last_offset = qVar4;
      input->buf_idx = qVar4 - lVar6;
      goto LAB_001e2842;
    }
  }
  input->buf_idx = 0;
  iVar2 = (*input->_vptr_InputSource[7])(input,input->buffer,0x80);
  input->buf_len = CONCAT44(extraout_var_00,iVar2);
  qVar4 = input->last_offset;
  input->buf_start = qVar4;
LAB_001e2842:
  offset = qVar4;
  if (this->state != st_token_ready) {
    do {
      lVar6 = input->buf_len;
      lVar7 = input->buf_idx;
      if (lVar7 < lVar6) {
        lVar5 = input->last_offset;
      }
      else {
        do {
          if (lVar6 == 0) {
            presentEOF(this);
            if ((this->type == tt_eof) && (this->allow_eof == false)) {
              this->type = tt_bad;
              std::__cxx11::string::_M_replace
                        ((ulong)&this->error_message,0,
                         (char *)(this->error_message)._M_string_length,0x279d58);
              offset = InputSource::getLastOffset(input);
            }
            goto LAB_001e2a08;
          }
          (*input->_vptr_InputSource[5])(input,lVar6 + input->buf_start,0);
          if (input->buf_len == 0) {
LAB_001e28e4:
            input->buf_idx = 0;
            iVar2 = (*input->_vptr_InputSource[7])(input,input->buffer,0x80);
            lVar6 = CONCAT44(extraout_var_02,iVar2);
            input->buf_len = lVar6;
            lVar5 = input->last_offset;
            input->buf_start = lVar5;
          }
          else {
            iVar2 = (*input->_vptr_InputSource[4])(input);
            lVar5 = CONCAT44(extraout_var_01,iVar2);
            lVar7 = input->buf_start;
            if ((lVar5 < lVar7) || (lVar6 = input->buf_len, lVar7 + lVar6 <= lVar5))
            goto LAB_001e28e4;
            input->last_offset = lVar5;
            input->buf_idx = lVar5 - lVar7;
          }
          lVar7 = input->buf_idx;
        } while (lVar6 <= lVar7);
      }
      ch = input->buffer[lVar7];
      input->buf_idx = lVar7 + 1;
      input->last_offset = lVar5 + 1;
      handleCharacter(this,ch);
      bVar1 = this->before_token;
      if (this->in_token == true) {
        std::__cxx11::string::push_back((char)this + '0');
      }
      offset = offset + (ulong)bVar1;
      if (max_len == 0) {
LAB_001e2a08:
        sVar3 = this->state;
      }
      else {
        sVar3 = this->state;
        if (sVar3 != st_token_ready && max_len <= (this->raw_val)._M_string_length) {
          this->type = tt_bad;
          this->state = st_token_ready;
          std::__cxx11::string::_M_replace
                    ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,
                     0x27a3a8);
          goto LAB_001e2a08;
        }
      }
    } while (sVar3 != st_token_ready);
    qVar4 = input->last_offset;
  }
  uVar8 = 0;
  if (this->in_token == false) {
    uVar8 = (ulong)this->before_token ^ 1;
  }
  input->last_offset = qVar4 - uVar8;
  (*input->_vptr_InputSource[5])(input,qVar4 - uVar8,0);
  if (this->type != tt_eof) {
    InputSource::setLastOffset(input,offset);
  }
  return (this->error_message)._M_string_length == 0;
}

Assistant:

bool
Tokenizer::nextToken(InputSource& input, std::string const& context, size_t max_len)
{
    if (state != st_inline_image) {
        reset();
    }
    qpdf_offset_t offset = input.fastTell();

    while (state != st_token_ready) {
        char ch;
        if (!input.fastRead(ch)) {
            presentEOF();

            if ((type == tt::tt_eof) && (!allow_eof)) {
                // Nothing in the qpdf library calls readToken without allowEOF anymore, so this
                // case is not exercised.
                type = tt::tt_bad;
                error_message = "unexpected EOF";
                offset = input.getLastOffset();
            }
        } else {
            handleCharacter(ch);
            if (before_token) {
                ++offset;
            }
            if (in_token) {
                raw_val += ch;
            }
            if (max_len && (raw_val.length() >= max_len) && (state != st_token_ready)) {
                // terminate this token now
                QTC::TC("qpdf", "QPDFTokenizer block long token");
                type = tt::tt_bad;
                state = st_token_ready;
                error_message = "exceeded allowable length while reading token";
            }
        }
    }

    input.fastUnread(!in_token && !before_token);

    if (type != tt::tt_eof) {
        input.setLastOffset(offset);
    }

    return error_message.empty();
}